

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O3

void * cf_lite_queue_pop_front(cf_lite_queue_t *self)

{
  void *pvVar1;
  cf_size_t cVar2;
  
  if (self->count == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = (void *)(self->elm_size * (ulong)self->head + (long)self->items);
    cVar2 = self->count - 1;
    self->count = cVar2;
    if (cVar2 == 0) {
      self->head = 0;
      self->tail = 0;
    }
    else {
      self->head = (cf_uint_t)((ulong)(self->head + 1) % self->capacity);
    }
  }
  return pvVar1;
}

Assistant:

void* cf_lite_queue_pop_front(cf_lite_queue_t* self) {
    void* data = CF_NULL_PTR;
    if (cf_lite_queue_empty(self)) {
        return CF_NULL_PTR;
    }
    data = cf_lite_queue_front(self);
    self->count--;
    if (self->count == 0) {
        self->head = 0;
        self->tail = 0;
    } else {
        self->head = (self->head + 1) % self->capacity;
    }
    return data;
}